

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.hh
# Opt level: O0

void __thiscall Pl_TIFFPredictor::~Pl_TIFFPredictor(Pl_TIFFPredictor *this)

{
  Pl_TIFFPredictor *this_local;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_TIFFPredictor_0058b6c0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->out);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&this->previous);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->cur_row);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_TIFFPredictor() override = default;